

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

int qc_poll_remove(QcPoll *poll,unsigned_long index)

{
  ulong uVar1;
  
  if (poll == (QcPoll *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x14c);
    __assert_fail("poll",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x14c,"int qc_poll_remove(QcPoll *, unsigned long)");
  }
  if (index != 0) {
    uVar1 = poll->num;
    if (index <= uVar1) {
      fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x14e);
      uVar1 = poll->num;
      if (index <= uVar1) {
        __assert_fail("poll->num < index",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                      ,0x14e,"int qc_poll_remove(QcPoll *, unsigned long)");
      }
    }
    for (; index < uVar1; index = index + 1) {
      poll->fdarray[index - 1] = poll->fdarray[index];
    }
    poll->num = uVar1 - 1;
    return 0;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x14d);
  __assert_fail("index>0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x14d,"int qc_poll_remove(QcPoll *, unsigned long)");
}

Assistant:

int qc_poll_remove(QcPoll *poll, unsigned long index)
{
    unsigned long i;

    qc_assert(poll);
    qc_assert(index>0);
    qc_assert(poll->num < index);

    for(i = index; i<poll->num; i++)
    {
        poll->fdarray[i-1].fd = poll->fdarray[i].fd;
        poll->fdarray[i-1].events  = poll->fdarray[i].events;
        poll->fdarray[i-1].revents = poll->fdarray[i].revents;
    }

    poll->num--;
    return 0;
}